

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O0

Matrix3x3 * __thiscall
CMU462::Matrix3x3::operator*(Matrix3x3 *__return_storage_ptr__,Matrix3x3 *this,double c)

{
  double dVar1;
  double *pdVar2;
  undefined4 local_30;
  undefined4 local_2c;
  int j;
  int i;
  Matrix3x3 *A;
  double c_local;
  Matrix3x3 *this_local;
  Matrix3x3 *B;
  
  Matrix3x3(__return_storage_ptr__);
  for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
      pdVar2 = operator()(this,local_2c,local_30);
      dVar1 = *pdVar2;
      pdVar2 = operator()(__return_storage_ptr__,local_2c,local_30);
      *pdVar2 = c * dVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix3x3 Matrix3x3::operator*( double c ) const {
    const Matrix3x3& A( *this );
    Matrix3x3 B;

    for( int i = 0; i < 3; i++ )
    for( int j = 0; j < 3; j++ )
    {
       B(i,j) = c*A(i,j);
    }

    return B;
  }